

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O0

void __thiscall UDPServer::on_output(UDPServer *this,Poll *p)

{
  int __fd;
  bool bVar1;
  reference pvVar2;
  long lVar3;
  void *__buf;
  size_t __n;
  ssize_t sVar4;
  ostream *poVar5;
  string local_78 [32];
  socklen_t local_58;
  socklen_t len;
  undefined1 local_48 [8];
  value_type msg;
  Poll *p_local;
  UDPServer *this_local;
  
  msg.second.sin_zero = (uchar  [8])p;
  bVar1 = std::
          queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>_>
          ::empty(&this->msg_queue);
  if (bVar1) {
    Subscriber::set_expected(&this->super_Subscriber,1);
    Poll::notify_subscriber_changed((Poll *)msg.second.sin_zero,&this->super_Subscriber);
  }
  else {
    pvVar2 = std::
             queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>_>
             ::front(&this->msg_queue);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>
            *)local_48,pvVar2);
    std::
    queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>_>
    ::pop(&this->msg_queue);
    local_58 = 0x10;
    lVar3 = std::__cxx11::string::size();
    __fd = (this->super_Subscriber).fd;
    __buf = (void *)std::__cxx11::string::operator[]((ulong)local_48);
    __n = std::__cxx11::string::size();
    sVar4 = sendto(__fd,__buf,__n,0,(sockaddr *)((long)&msg.first.field_2 + 8),local_58);
    if (lVar3 != sVar4) {
      poVar5 = std::operator<<((ostream *)&std::cout,"UDPServer: error in writing to udp socket ");
      from_errno_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_78);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_78);
    }
    bVar1 = std::
            queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>_>
            ::empty(&this->msg_queue);
    if (bVar1) {
      Subscriber::set_expected(&this->super_Subscriber,1);
      Poll::notify_subscriber_changed((Poll *)msg.second.sin_zero,&this->super_Subscriber);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>
             *)local_48);
  }
  return;
}

Assistant:

void UDPServer::on_output(Poll &p) {
  if (msg_queue.empty()) {
    set_expected(POLLIN);
    p.notify_subscriber_changed(*this);
    return;
  }
  auto msg = msg_queue.front();
  msg_queue.pop();
  socklen_t len = sizeof(msg.second);
  if (msg.first.size() != sendto(fd, &msg.first[0], msg.first.size(), 0, (struct sockaddr *) &msg.second, len)) {
    std::cout << "UDPServer: error in writing to udp socket " << from_errno() << std::endl;
  }
  if (msg_queue.empty()) {
    set_expected(POLLIN);
    p.notify_subscriber_changed(*this);
  }
}